

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_extension.cpp
# Opt level: O1

void duckdb::ArrowJson::PopulateSchema
               (DuckDBArrowSchemaHolder *root_holder,ArrowSchema *schema,LogicalType *type,
               ClientContext *context,ArrowTypeExtension *extension)

{
  undefined1 *puVar1;
  reference pvVar2;
  char *pcVar3;
  char *pcVar4;
  ClientProperties options;
  ArrowSchemaMetadata schema_metadata;
  string local_108;
  undefined1 local_e8 [34];
  bool bStack_c6;
  undefined5 uStack_c5;
  undefined1 local_b8 [16];
  _Alloc_hider local_a8;
  char local_98 [16];
  _Alloc_hider local_88;
  char local_78 [16];
  ArrowSchemaMetadata local_68;
  
  ArrowExtensionMetadata::ArrowExtensionMetadata
            ((ArrowExtensionMetadata *)local_e8,&extension->extension_metadata);
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_108,local_e8._0_8_,(pointer)(local_e8._0_8_ + local_e8._8_8_));
  ArrowSchemaMetadata::ArrowCanonicalType(&local_68,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  if (local_88._M_p != local_78) {
    operator_delete(local_88._M_p);
  }
  if (local_a8._M_p != local_98) {
    operator_delete(local_a8._M_p);
  }
  puVar1 = (undefined1 *)
           CONCAT53(uStack_c5,CONCAT12(bStack_c6,CONCAT11(local_e8[0x21],local_e8[0x20])));
  if (puVar1 != local_b8) {
    operator_delete(puVar1);
  }
  if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
    operator_delete((void *)local_e8._0_8_);
  }
  ArrowSchemaMetadata::SerializeMetadata((ArrowSchemaMetadata *)local_e8);
  ::std::
  vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
  ::emplace_back<duckdb::unique_ptr<char[],std::default_delete<char>,false>>
            ((vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
              *)&root_holder->metadata_info,
             (unique_ptr<char[],_std::default_delete<char>,_false> *)local_e8);
  if ((pointer)local_e8._0_8_ != (pointer)0x0) {
    operator_delete__((void *)local_e8._0_8_);
  }
  pvVar2 = vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_true>::back
                     (&root_holder->metadata_info);
  schema->metadata =
       (pvVar2->super_unique_ptr<char[],_std::default_delete<char[]>_>)._M_t.
       super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
       super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
       super__Head_base<0UL,_char_*,_false>._M_head_impl;
  ClientContext::GetClientProperties((ClientProperties *)local_e8,context);
  pcVar4 = "u";
  if (local_e8[0x20] == LARGE) {
    pcVar4 = "U";
  }
  pcVar3 = "vu";
  if (bStack_c6 == false) {
    pcVar3 = pcVar4;
  }
  schema->format = pcVar3;
  if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
    operator_delete((void *)local_e8._0_8_);
  }
  ::std::unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>::~unique_ptr
            (&local_68.extension_metadata_map.
              super_unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_68);
  return;
}

Assistant:

static void PopulateSchema(DuckDBArrowSchemaHolder &root_holder, ArrowSchema &schema, const LogicalType &type,
	                           ClientContext &context, const ArrowTypeExtension &extension) {
		const ArrowSchemaMetadata schema_metadata =
		    ArrowSchemaMetadata::ArrowCanonicalType(extension.GetInfo().GetExtensionName());
		root_holder.metadata_info.emplace_back(schema_metadata.SerializeMetadata());
		schema.metadata = root_holder.metadata_info.back().get();
		const auto options = context.GetClientProperties();
		if (options.produce_arrow_string_view) {
			schema.format = "vu";
		} else {
			if (options.arrow_offset_size == ArrowOffsetSize::LARGE) {
				schema.format = "U";
			} else {
				schema.format = "u";
			}
		}
	}